

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenUnionInit
          (PythonGenerator *this,FieldDef *field,string *field_types_ptr,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_list,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *import_typing_list)

{
  BaseType BVar1;
  EnumDef *pEVar2;
  EnumVal *pEVar3;
  pointer ppEVar4;
  string field_type;
  string separator_string;
  string package_reference;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&separator_string,"Union",(allocator<char> *)&field_type);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)import_typing_list,&separator_string);
  std::__cxx11::string::~string((string *)&separator_string);
  std::__cxx11::string::assign((char *)field_types_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&separator_string,", ",(allocator<char> *)&field_type);
  pEVar2 = (field->value).type.enum_def;
  for (ppEVar4 = (pEVar2->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (pEVar2->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    pEVar3 = *ppEVar4;
    field_type._M_dataplus._M_p = (pointer)&field_type.field_2;
    field_type._M_string_length = 0;
    field_type.field_2._M_local_buf[0] = '\0';
    BVar1 = (pEVar3->union_type).base_type;
    if ((BVar1 == BASE_TYPE_NONE) || (BVar1 == BASE_TYPE_STRING)) {
      std::__cxx11::string::append((char *)&field_type);
    }
    else if (BVar1 == BASE_TYPE_STRUCT) {
      (*(this->namer_).super_Namer._vptr_Namer[0x11])
                (&package_reference,&this->namer_,(pEVar3->union_type).struct_def);
      std::__cxx11::string::operator=((string *)&field_type,(string *)&package_reference);
      std::__cxx11::string::~string((string *)&package_reference);
      if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
        GenPackageReference_abi_cxx11_(&package_reference,this,&pEVar3->union_type);
        std::operator+(&local_70,&package_reference,".");
        std::operator+(&local_50,&local_70,&field_type);
        std::__cxx11::string::operator=((string *)&field_type,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_50,"import ",&package_reference);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)import_list,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&package_reference);
      }
    }
    std::operator+(&package_reference,&field_type,&separator_string);
    std::__cxx11::string::append((string *)field_types_ptr);
    std::__cxx11::string::~string((string *)&package_reference);
    std::__cxx11::string::~string((string *)&field_type);
  }
  std::__cxx11::string::erase
            ((ulong)field_types_ptr,
             field_types_ptr->_M_string_length - separator_string._M_string_length);
  std::__cxx11::string::append((char *)field_types_ptr);
  if ((((this->super_BaseGenerator).parser_)->opts).include_dependence_headers == true) {
    GenPackageReference_abi_cxx11_(&field_type,this,&(field->value).type);
    std::operator+(&package_reference,"import ",&field_type);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)import_list,&package_reference);
    std::__cxx11::string::~string((string *)&package_reference);
    std::__cxx11::string::~string((string *)&field_type);
  }
  std::__cxx11::string::~string((string *)&separator_string);
  return;
}

Assistant:

void GenUnionInit(const FieldDef &field, std::string *field_types_ptr,
                    std::set<std::string> *import_list,
                    std::set<std::string> *import_typing_list) const {
    // Gets all possible types in the union.
    import_typing_list->insert("Union");
    auto &field_types = *field_types_ptr;
    field_types = "Union[";

    std::string separator_string = ", ";
    auto enum_def = field.value.type.enum_def;
    for (auto it = enum_def->Vals().begin(); it != enum_def->Vals().end();
         ++it) {
      auto &ev = **it;
      // Union only supports string and table.
      std::string field_type;
      switch (ev.union_type.base_type) {
        case BASE_TYPE_STRUCT:
          field_type = namer_.ObjectType(*ev.union_type.struct_def);
          if (parser_.opts.include_dependence_headers) {
            auto package_reference = GenPackageReference(ev.union_type);
            field_type = package_reference + "." + field_type;
            import_list->insert("import " + package_reference);
          }
          break;
        case BASE_TYPE_STRING: field_type += "str"; break;
        case BASE_TYPE_NONE: field_type += "None"; break;
        default: break;
      }
      field_types += field_type + separator_string;
    }

    // Removes the last separator_string.
    field_types.erase(field_types.length() - separator_string.size());
    field_types += "]";

    // Gets the import lists for the union.
    if (parser_.opts.include_dependence_headers) {
      const auto package_reference = GenPackageReference(field.value.type);
      import_list->insert("import " + package_reference);
    }
  }